

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          String *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,ArrayPtr<const_char> *rest_6,
          ArrayPtr<const_char> *rest_7,String *rest_8,ArrayPtr<const_char> *rest_9,String *rest_10,
          ArrayPtr<const_char> *rest_11,ArrayPtr<const_char> *rest_12,ArrayPtr<const_char> *rest_13,
          CappedArray<char,_8UL> *rest_14,ArrayPtr<const_char> *rest_15)

{
  Array<char> *pAVar1;
  size_t pos_00;
  char *pcVar2;
  Branch *pBVar3;
  String *pSVar4;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  String *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  String *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  CappedArray<char,_8UL> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  StringTree local_98;
  String *local_60;
  String *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_60 = rest_1;
  rest_local_1 = (String *)rest;
  rest_local = (ArrayPtr<const_char> *)first;
  first_local = (String *)branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar2 = String::begin(&this->text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar3->index = (long)pos - (long)pcVar2;
  pSVar4 = mv<kj::String>((String *)rest_local);
  StringTree(&local_98,pSVar4);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar3->content,&local_98);
  ~StringTree(&local_98);
  pos_00 = branchIndex_local;
  pAVar1 = &first_local->content;
  first_00 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)rest_local_1);
  pSVar4 = fwd<kj::String>(local_60);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::String>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::String>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::CappedArray<char,8ul>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (this,(char *)pos_00,(size_t)((long)&pAVar1->ptr + 1),first_00,pSVar4,rest_1_00,
             rest_2_00,rest_3_00,rest_4_00,rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,
             rest_10_00,rest_11_00,rest_12_00,rest_13_00,rest_14_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}